

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

void __thiscall randomx::Cpu::Cpu(Cpu *this)

{
  undefined1 *in_RDI;
  int nIds;
  int info [4];
  int local_18;
  uint local_14;
  uint local_10;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  cpuid(&local_18,0);
  if (0 < local_18) {
    cpuid(&local_18,1);
    in_RDI[1] = (local_10 & 0x200) != 0;
    *in_RDI = (local_10 & 0x2000000) != 0;
  }
  if (6 < local_18) {
    cpuid(&local_18,7);
    in_RDI[2] = (local_14 & 0x20) != 0;
  }
  return;
}

Assistant:

Cpu::Cpu() : aes_(false), ssse3_(false), avx2_(false) {
#ifdef HAVE_CPUID
		int info[4];
		cpuid(info, 0);
		int nIds = info[0];
		if (nIds >= 0x00000001) {
			cpuid(info, 0x00000001);
			ssse3_ = (info[2] & (1 << 9)) != 0;
			aes_ = (info[2] & (1 << 25)) != 0;
		}
		if (nIds >= 0x00000007) {
			cpuid(info, 0x00000007);
			avx2_ = (info[1] & (1 << 5)) != 0;
		}
#elif defined(__aarch64__) && defined(HWCAP_AES)
		long hwcaps = getauxval(AT_HWCAP);
		aes_ = (hwcaps & HWCAP_AES) != 0;
#endif
		//TODO POWER8 AES
	}